

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O3

void qsoundc_write_data(void *info,UINT8 address,UINT16 data)

{
  UINT16 *pUVar1;
  
  if ((*(char *)((long)info + 0x149c) == '\0') && (*(char *)((long)info + 0x149d) != '\0')) {
    while ((*(short *)((long)info + 0x1492) != 0x314 && (*(short *)((long)info + 0x1492) != 0x6b2)))
    {
      update_sample((qsound_chip *)info);
    }
    while ((*(short *)((long)info + 0x1490) != 0x314 && (*(short *)((long)info + 0x1490) != 0x6b2)))
    {
      update_sample((qsound_chip *)info);
    }
  }
  pUVar1 = *(UINT16 **)((long)info + (ulong)address * 8 + 0x14a0);
  if (pUVar1 != (UINT16 *)0x0) {
    *pUVar1 = data;
  }
  *(undefined1 *)((long)info + 0x149c) = 0;
  return;
}

Assistant:

static void qsoundc_write_data(void* info, UINT8 address, UINT16 data)
{
	struct qsound_chip* chip = (struct qsound_chip*)info;
	UINT16 *destination;

	if (! chip->ready_flag && chip->opt_nowait)
		update_flush(chip);

	destination = chip->register_map[address];
	if(destination)
		*destination = data;
	chip->ready_flag = 0;

	return;
}